

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborContainerPrivate * assignContainer(QCborContainerPrivate **d,QCborContainerPrivate *x)

{
  QCborContainerPrivate *in_RSI;
  QCborContainerPrivate *in_RDI;
  undefined8 local_8;
  
  if (*(QCborContainerPrivate **)in_RDI == in_RSI) {
    local_8 = *(QCborContainerPrivate **)in_RDI;
  }
  else {
    if (*(long *)in_RDI != 0) {
      QCborContainerPrivate::deref(in_RDI);
    }
    if (in_RSI != (QCborContainerPrivate *)0x0) {
      QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x193922);
    }
    *(QCborContainerPrivate **)in_RDI = in_RSI;
    local_8 = in_RSI;
  }
  return local_8;
}

Assistant:

static QCborContainerPrivate *assignContainer(QCborContainerPrivate *&d, QCborContainerPrivate *x)
{
    if (d == x)
        return d;
    if (d)
        d->deref();
    if (x)
        x->ref.ref();
    return d = x;
}